

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

void array_bitset_ixor_test(void)

{
  int iVar1;
  array_container_t *paVar2;
  bitset_container_t *pbVar3;
  bitset_container_t *bitset;
  bitset_container_t *bitset_00;
  bitset_container_t *bitset_01;
  container_t *C;
  int cx;
  int x_2;
  int x_1;
  int x;
  bitset_container_t *BX;
  bitset_container_t *B2;
  bitset_container_t *B1mod;
  bitset_container_t *B1copy;
  bitset_container_t *B1;
  array_container_t *AX;
  array_container_t *A2;
  array_container_t *A1mod;
  array_container_t *A1copy;
  array_container_t *A1;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  uint16_t in_stack_ffffffffffffff7e;
  array_container_t *in_stack_ffffffffffffff80;
  bitset_container_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  
  array_container_create();
  array_container_create();
  array_container_create();
  array_container_create();
  paVar2 = array_container_create();
  pbVar3 = bitset_container_create();
  bitset_container_create();
  bitset = bitset_container_create();
  bitset_00 = bitset_container_create();
  bitset_01 = bitset_container_create();
  for (local_54 = 0; local_54 < 0x10000; local_54 = local_54 + 3) {
    array_container_add(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
    bitset_container_set(pbVar3,(uint16_t)local_54);
  }
  for (local_58 = 0; local_58 < 0x10000; local_58 = local_58 + 0x3e) {
    array_container_add(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
    bitset_container_set(bitset_00,(uint16_t)local_58);
  }
  for (local_5c = 0; local_5c < 0x10000; local_5c = local_5c + 1) {
    in_stack_ffffffffffffff94 = (uint)(local_5c % 0x3e == 0);
    if (in_stack_ffffffffffffff94 != (local_5c % 3 == 0)) {
      array_container_add(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
      bitset_container_set(bitset_01,(uint16_t)local_5c);
    }
  }
  array_container_copy
            (in_stack_ffffffffffffff80,
             (array_container_t *)
             CONCAT26(in_stack_ffffffffffffff7e,
                      CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  bitset_container_copy
            ((bitset_container_t *)in_stack_ffffffffffffff80,
             (bitset_container_t *)
             CONCAT26(in_stack_ffffffffffffff7e,
                      CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  array_container_copy
            (in_stack_ffffffffffffff80,
             (array_container_t *)
             CONCAT26(in_stack_ffffffffffffff7e,
                      CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  array_container_add(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
  bitset_container_copy
            ((bitset_container_t *)in_stack_ffffffffffffff80,
             (bitset_container_t *)
             CONCAT26(in_stack_ffffffffffffff7e,
                      CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  bitset_container_add(bitset,2);
  iVar1 = array_container_cardinality(paVar2);
  bitset_array_container_ixor
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (container_t **)
             CONCAT26(in_stack_ffffffffffffff7e,
                      CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
               CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  pbVar3 = (bitset_container_t *)(long)iVar1;
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (unsigned_long)in_stack_ffffffffffffff88,(char *)pbVar3,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  _assert_int_equal(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (unsigned_long)in_stack_ffffffffffffff88,(char *)pbVar3,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  array_bitset_container_ixor
            ((array_container_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88,(container_t **)pbVar3);
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,(char *)pbVar3,
               CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  paVar2 = (array_container_t *)(long)iVar1;
  bitset_container_cardinality((bitset_container_t *)0x0);
  _assert_int_equal(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (unsigned_long)paVar2,(char *)pbVar3,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  _assert_int_not_equal
            (CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(unsigned_long)paVar2,
             (char *)pbVar3,CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  bitset_container_free((bitset_container_t *)0x107f37);
  array_bitset_container_ixor
            ((array_container_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (bitset_container_t *)paVar2,(container_t **)pbVar3);
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(char *)paVar2,
               (char *)pbVar3,CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (unsigned_long)paVar2,(char *)pbVar3,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  array_container_free((array_container_t *)0x107fa5);
  bitset_bitset_container_ixor
            ((bitset_container_t *)paVar2,pbVar3,
             (container_t **)
             CONCAT26(in_stack_ffffffffffffff7e,
                      CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(char *)paVar2,
               (char *)pbVar3,CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (unsigned_long)paVar2,(char *)pbVar3,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  array_container_free((array_container_t *)0x108011);
  array_array_container_ixor
            ((array_container_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             paVar2,(container_t **)pbVar3);
  _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(char *)paVar2,
               (char *)pbVar3,CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  array_container_cardinality((array_container_t *)0x0);
  _assert_int_equal(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (unsigned_long)paVar2,(char *)pbVar3,
                    CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
  array_container_free((array_container_t *)0x10807d);
  array_container_free((array_container_t *)0x108087);
  bitset_container_free((bitset_container_t *)0x108091);
  bitset_container_free((bitset_container_t *)0x10809b);
  bitset_container_free((bitset_container_t *)0x1080a5);
  bitset_container_free((bitset_container_t *)0x1080af);
  array_container_free((array_container_t *)0x1080b9);
  return;
}

Assistant:

DEFINE_TEST(array_bitset_ixor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A1copy = array_container_create();
    array_container_t* A1mod = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B1copy = bitset_container_create();
    bitset_container_t* B1mod = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x += 3) {
        array_container_add(A1, x);
        bitset_container_set(B1, x);
    }

    // important: 62 is not divisible by 3
    for (int x = 0; x < (1 << 16); x += 62) {
        array_container_add(A2, x);
        bitset_container_set(B2, x);
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 == 0) ^ (x % 3 == 0)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    array_container_copy(A1, A1copy);
    bitset_container_copy(B1, B1copy);
    array_container_copy(A1, A1mod);
    array_container_add(A1mod, 2);
    bitset_container_copy(B1, B1mod);
    bitset_container_add(B1mod, 2);

    int cx = array_container_cardinality(AX);  // expected xor

    container_t* C = NULL;

    assert_true(bitset_array_container_ixor(B2, A1, &C));
    assert_int_equal(cx, bitset_container_cardinality(CAST_bitset(C)));
    // this case, result is inplace
    assert_ptr_equal(C, B2);

    C = NULL;
    assert_true(array_bitset_container_ixor(A2, B1, &C));
    assert_int_equal(cx, bitset_container_cardinality(CAST_bitset(C)));
    assert_ptr_not_equal(C, A2);  // nb A2 is destroyed
    // don't test a case where result can fit in the array
    // until this is implemented...at that point, make sure

    bitset_container_free(CAST_bitset(C));
    C = NULL;
    // xoring something with itself, getting array
    assert_false(array_bitset_container_ixor(A1, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));

    array_container_free(CAST_array(C));
    C = NULL;

    // B1mod and B1copy differ in position 2 only
    assert_false(bitset_bitset_container_ixor(B1mod, B1copy, &C));
    assert_int_equal(1, array_container_cardinality(CAST_array(C)));

    array_container_free(CAST_array(C));
    C = NULL;
    assert_false(array_array_container_ixor(A1mod, A1copy, &C));
    assert_int_equal(1, array_container_cardinality(CAST_array(C)));

    // array_container_free(A1); // disposed already
    //    array_container_free(A2); // has been disposed already
    array_container_free(AX);
    array_container_free(A1copy);

    bitset_container_free(B1);
    bitset_container_free(B1copy);
    bitset_container_free(B2);
    bitset_container_free(BX);
    array_container_free(CAST_array(C));
}